

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  size_t sVar12;
  long lVar13;
  int *piVar14;
  ZSTD_CCtx_params *pZVar15;
  int *piVar16;
  undefined8 *puVar17;
  byte bVar18;
  ZSTD_CCtx_params in_stack_fffffffffffffe98;
  ZSTD_format_e local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  ZSTD_compressionParameters local_c4;
  ZSTD_CCtx_params local_a8;
  
  local_a8.fParams.noDictIDFlag = fParams.noDictIDFlag;
  local_a8.fParams._0_8_ = fParams._0_8_;
  bVar18 = 0;
  if (cdict != (ZSTD_CDict *)0x0) {
    uVar1 = (zcs->requestedParams).format;
    piVar14 = &(zcs->requestedParams).compressionLevel;
    piVar16 = &local_a8.compressionLevel;
    for (lVar13 = 0x15; lVar13 != 0; lVar13 = lVar13 + -1) {
      *piVar16 = *piVar14;
      piVar14 = piVar14 + 1;
      piVar16 = piVar16 + 1;
    }
    uVar2 = (cdict->matchState).cParams.windowLog;
    uVar3 = (cdict->matchState).cParams.chainLog;
    uVar4 = (cdict->matchState).cParams.hashLog;
    uVar5 = (cdict->matchState).cParams.searchLog;
    uVar6 = (cdict->matchState).cParams.minMatch;
    local_a8.cParams.targetLength = (cdict->matchState).cParams.targetLength;
    local_a8.cParams.strategy = (cdict->matchState).cParams.strategy;
    local_a8.format = uVar1;
    local_a8.cParams.windowLog = uVar2;
    local_a8.cParams.chainLog = uVar3;
    local_a8.cParams.hashLog = uVar4;
    local_a8.cParams.searchLog = uVar5;
    local_a8.cParams.minMatch = uVar6;
    ZSTD_getCParamsFromCCtxParams(&local_c4,&local_a8,pledgedSrcSize,0);
    uVar7 = (cdict->matchState).cParams.windowLog;
    uVar8 = (cdict->matchState).cParams.chainLog;
    uVar9 = (cdict->matchState).cParams.hashLog;
    uVar10 = (cdict->matchState).cParams.searchLog;
    uVar11 = (cdict->matchState).cParams.minMatch;
    local_a8.cParams.targetLength = (cdict->matchState).cParams.targetLength;
    local_a8.cParams.strategy = (cdict->matchState).cParams.strategy;
    local_a8.cParams.windowLog = uVar7;
    local_a8.cParams.chainLog = uVar8;
    local_a8.cParams.hashLog = uVar9;
    local_a8.cParams.searchLog = uVar10;
    local_a8.cParams.minMatch = uVar11;
    ZSTD_freeCDict(zcs->cdictLocal);
    zcs->cdictLocal = (ZSTD_CDict *)0x0;
    zcs->cdict = cdict;
    pZVar15 = &local_a8;
    puVar17 = (undefined8 *)&stack0xfffffffffffffe98;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar17 = *(undefined8 *)pZVar15;
      pZVar15 = (ZSTD_CCtx_params *)((long)pZVar15 + (ulong)bVar18 * -0x10 + 8);
      puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
    }
    sVar12 = ZSTD_resetCStream_internal
                       (zcs,(void *)0x0,0,ZSTD_dct_auto,cdict,in_stack_fffffffffffffe98,
                        pledgedSrcSize);
    return sVar12;
  }
  return 0xffffffffffffffe0;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    if (!cdict) return ERROR(dictionary_wrong); /* cannot handle NULL cdict (does not know what to do) */
    {   ZSTD_CCtx_params params = zcs->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        params.fParams = fParams;
        return ZSTD_initCStream_internal(zcs,
                                NULL, 0, cdict,
                                params, pledgedSrcSize);
    }
}